

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

timediff_t
Curl_pgrsLimitWaitTime
          (curl_off_t cursize,curl_off_t startsize,curl_off_t limit,curltime start,curltime now)

{
  long lVar1;
  timediff_t tVar2;
  curltime older;
  curltime newer;
  timediff_t actual;
  timediff_t minimum;
  curl_off_t size;
  curl_off_t limit_local;
  curl_off_t startsize_local;
  curl_off_t cursize_local;
  curltime start_local;
  
  lVar1 = cursize - startsize;
  if ((limit == 0) || (lVar1 == 0)) {
    start_local.tv_usec = 0;
    start_local._12_4_ = 0;
  }
  else {
    if (lVar1 < 0x20c49ba5e353f7) {
      actual = (lVar1 * 1000) / limit;
    }
    else if (lVar1 / limit < 0x20c49ba5e353f7) {
      actual = (lVar1 / limit) * 1000;
    }
    else {
      actual = 0x7fffffffffffffff;
    }
    older._12_4_ = 0;
    older.tv_sec = SUB128(start._0_12_,0);
    older.tv_usec = SUB124(start._0_12_,8);
    newer._12_4_ = 0;
    newer.tv_sec = now.tv_sec;
    newer.tv_usec = now.tv_usec;
    tVar2 = Curl_timediff(newer,older);
    if (tVar2 < actual) {
      start_local._8_8_ = actual - tVar2;
    }
    else {
      start_local.tv_usec = 0;
      start_local._12_4_ = 0;
    }
  }
  return start_local._8_8_;
}

Assistant:

timediff_t Curl_pgrsLimitWaitTime(curl_off_t cursize,
                                  curl_off_t startsize,
                                  curl_off_t limit,
                                  struct curltime start,
                                  struct curltime now)
{
  curl_off_t size = cursize - startsize;
  timediff_t minimum;
  timediff_t actual;

  if(!limit || !size)
    return 0;

  /*
   * 'minimum' is the number of milliseconds 'size' should take to download to
   * stay below 'limit'.
   */
  if(size < CURL_OFF_T_MAX/1000)
    minimum = (timediff_t) (CURL_OFF_T_C(1000) * size / limit);
  else {
    minimum = (timediff_t) (size / limit);
    if(minimum < TIMEDIFF_T_MAX/1000)
      minimum *= 1000;
    else
      minimum = TIMEDIFF_T_MAX;
  }

  /*
   * 'actual' is the time in milliseconds it took to actually download the
   * last 'size' bytes.
   */
  actual = Curl_timediff(now, start);
  if(actual < minimum) {
    /* if it downloaded the data faster than the limit, make it wait the
       difference */
    return (minimum - actual);
  }

  return 0;
}